

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::remove_edge(Graph *this,vertex_t s,vertex_t t)

{
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_00;
  pointer puVar1;
  reference pvVar2;
  reference pvVar3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var4
  ;
  reference pvVar5;
  ulong __n;
  undefined8 local_38;
  
  local_38 = CONCAT44(s,t);
  __n = (ulong)s;
  pvVar2 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::at(&this->succ_,__n);
  pvVar3 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::at(&this->succ_,__n);
  puVar1 = (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pvVar3 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::at(&this->succ_,__n);
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                    (puVar1,(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            )._M_impl.super__Vector_impl_data._M_finish,&local_38);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
            (pvVar2,(const_iterator)_Var4._M_current);
  this_00 = &this->pred_;
  pvVar2 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::at(this_00,local_38 & 0xffffffff);
  pvVar3 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::at(this_00,local_38 & 0xffffffff);
  puVar1 = (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pvVar3 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::at(this_00,local_38 & 0xffffffff);
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                    (puVar1,(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            )._M_impl.super__Vector_impl_data._M_finish,(long)&local_38 + 4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
            (pvVar2,(const_iterator)_Var4._M_current);
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                     (&this->deg_,local_38 >> 0x20);
  *pvVar5 = *pvVar5 - 1;
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                     (&this->deg_,local_38 & 0xffffffff);
  *pvVar5 = *pvVar5 - 1;
  return;
}

Assistant:

void Graph::remove_edge(vertex_t s, vertex_t t) {
    // TODO check existence
    succ_.at(s).erase(find(succ_.at(s).begin(), succ_.at(s).end(), t));
    pred_.at(t).erase(find(pred_.at(t).begin(), pred_.at(t).end(), s));

    --deg_.at(s);
    --deg_.at(t);
}